

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

void MemoryProfiler::PrintAll(void)

{
  Output::Print(
               L"========================================================================================================\n"
               );
  Output::Print(L"Memory Profile (All threads)\n");
  ForEachProfiler<MemoryProfiler::PrintAll()::__0>();
  Output::Flush();
  return;
}

Assistant:

void
MemoryProfiler::PrintAll()
{
    Output::Print(_u("========================================================================================================\n"));
    Output::Print(_u("Memory Profile (All threads)\n"));

    ForEachProfiler([] (MemoryProfiler * memoryProfiler)
    {
        memoryProfiler->Print();
    });

    Output::Flush();
}